

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void __thiscall
google::protobuf::TestUtil::ReflectionTester::SetAllFieldsViaReflection
          (ReflectionTester *this,Message *message)

{
  FieldDescriptor *pFVar1;
  Message *pMVar2;
  Reflection *this_00;
  Metadata MVar3;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  MVar3 = Message::GetMetadata(message);
  this_00 = MVar3.reflection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_int32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x65);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_int64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x66);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_uint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt32(this_00,message,pFVar1,0x67);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_uint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt64(this_00,message,pFVar1,0x68);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_sint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x69);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_sint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x6a);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_fixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt32(this_00,message,pFVar1,0x6b);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_fixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt64(this_00,message,pFVar1,0x6c);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_sfixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x6d);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_sfixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x6e);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_float",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetFloat(this_00,message,pFVar1,111.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_double",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetDouble(this_00,message,pFVar1,112.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_bool",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetBool(this_00,message,pFVar1,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_string",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"115",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_bytes",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"116",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optionalgroup",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->group_a_,0x75);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_nested_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x76);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_foreign_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->foreign_c_,0x77);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_import_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->import_d_,0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_nested_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->nested_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_foreign_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->foreign_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_import_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->import_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_string_piece",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"124",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_cord",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"125",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_bytes_cord",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"optional bytes cord",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_public_import_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->import_e_,0x7e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_lazy_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x7f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"optional_unverified_lazy_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_int32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0xc9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_int64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0xca);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_uint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt32(this_00,message,pFVar1,0xcb);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_uint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt64(this_00,message,pFVar1,0xcc);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0xcd);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0xce);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_fixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt32(this_00,message,pFVar1,0xcf);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_fixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt64(this_00,message,pFVar1,0xd0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sfixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0xd1);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sfixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0xd2);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_float",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddFloat(this_00,message,pFVar1,211.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_double",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddDouble(this_00,message,pFVar1,212.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_bool",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddBool(this_00,message,pFVar1,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_string",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"215",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_bytes",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"216",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeatedgroup",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->repeated_group_a_,0xd9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_nested_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0xda);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_foreign_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->foreign_c_,0xdb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_import_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->import_d_,0xdc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_lazy_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0xe3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_nested_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->nested_bar_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_foreign_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->foreign_bar_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_import_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->import_bar_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_string_piece",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"224",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_cord",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"225",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_int32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0x12d);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_int64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0x12e);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_uint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt32(this_00,message,pFVar1,0x12f);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_uint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt64(this_00,message,pFVar1,0x130);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0x131);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0x132);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_fixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt32(this_00,message,pFVar1,0x133);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_fixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddUInt64(this_00,message,pFVar1,0x134);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sfixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt32(this_00,message,pFVar1,0x135);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_sfixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddInt64(this_00,message,pFVar1,0x136);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_float",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddFloat(this_00,message,pFVar1,311.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_double",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddDouble(this_00,message,pFVar1,312.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_bool",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddBool(this_00,message,pFVar1,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_string",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"315",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_bytes",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"316",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeatedgroup",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->repeated_group_a_,0x13d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_nested_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x13e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_foreign_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->foreign_c_,0x13f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_import_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->import_d_,0x140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_lazy_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::AddMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x147);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_nested_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->nested_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_foreign_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->foreign_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_import_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::AddEnum(this_00,message,pFVar1,this->import_baz_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_string_piece",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"324",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"repeated_cord",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"325",&local_2a1);
  Reflection::AddString(this_00,message,pFVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_int32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x191);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_int64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x192);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_uint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt32(this_00,message,pFVar1,0x193);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_uint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt64(this_00,message,pFVar1,0x194);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_sint32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x195);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_sint64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x196);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_fixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt32(this_00,message,pFVar1,0x197);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_fixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt64(this_00,message,pFVar1,0x198);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_sfixed32",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt32(this_00,message,pFVar1,0x199);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_sfixed64",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetInt64(this_00,message,pFVar1,0x19a);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_float",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetFloat(this_00,message,pFVar1,411.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_double",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetDouble(this_00,message,pFVar1,412.0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"default_bool",&local_2a2)
  ;
  pFVar1 = F(this,&local_2a0);
  Reflection::SetBool(this_00,message,pFVar1,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_string",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"415",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_bytes",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"416",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_nested_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->nested_foo_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_foreign_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->foreign_foo_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_import_enum",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  Reflection::SetEnum(this_00,message,pFVar1,this->import_foo_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"default_string_piece",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"424",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"default_cord",&local_2a2)
  ;
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"425",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"oneof_uint32",&local_2a2)
  ;
  pFVar1 = F(this,&local_2a0);
  Reflection::SetUInt32(this_00,message,pFVar1,0x259);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"oneof_nested_message",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  pMVar2 = Reflection::MutableMessage(this_00,message,pFVar1,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  MVar3 = Message::GetMetadata(pMVar2);
  Reflection::SetInt32(MVar3.reflection,pMVar2,this->nested_b_,0x25a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"oneof_string",&local_2a2)
  ;
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"603",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"oneof_bytes",&local_2a2);
  pFVar1 = F(this,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"604",&local_2a1);
  Reflection::SetString(this_00,message,pFVar1,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::SetAllFieldsViaReflection(
    Message* message) {
  const Reflection* reflection = message->GetReflection();
  Message* sub_message;

  reflection->SetInt32(message, F("optional_int32"), 101);
  reflection->SetInt64(message, F("optional_int64"), 102);
  reflection->SetUInt32(message, F("optional_uint32"), 103);
  reflection->SetUInt64(message, F("optional_uint64"), 104);
  reflection->SetInt32(message, F("optional_sint32"), 105);
  reflection->SetInt64(message, F("optional_sint64"), 106);
  reflection->SetUInt32(message, F("optional_fixed32"), 107);
  reflection->SetUInt64(message, F("optional_fixed64"), 108);
  reflection->SetInt32(message, F("optional_sfixed32"), 109);
  reflection->SetInt64(message, F("optional_sfixed64"), 110);
  reflection->SetFloat(message, F("optional_float"), 111);
  reflection->SetDouble(message, F("optional_double"), 112);
  reflection->SetBool(message, F("optional_bool"), true);
  reflection->SetString(message, F("optional_string"), "115");
  reflection->SetString(message, F("optional_bytes"), "116");

  sub_message = reflection->MutableMessage(message, F("optionalgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, group_a_, 117);
  sub_message =
      reflection->MutableMessage(message, F("optional_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 118);
  sub_message =
      reflection->MutableMessage(message, F("optional_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 119);
  sub_message =
      reflection->MutableMessage(message, F("optional_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 120);

  reflection->SetEnum(message, F("optional_nested_enum"), nested_baz_);
  reflection->SetEnum(message, F("optional_foreign_enum"), foreign_baz_);
  reflection->SetEnum(message, F("optional_import_enum"), import_baz_);

  reflection->SetString(message, F("optional_string_piece"), "124");
  reflection->SetString(message, F("optional_cord"), "125");
  reflection->SetString(message, F("optional_bytes_cord"),
                        "optional bytes cord");

  sub_message =
      reflection->MutableMessage(message, F("optional_public_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_e_, 126);

  sub_message = reflection->MutableMessage(message, F("optional_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 127);

  sub_message = reflection->MutableMessage(
      message, F("optional_unverified_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 128);

  // -----------------------------------------------------------------

  reflection->AddInt32(message, F("repeated_int32"), 201);
  reflection->AddInt64(message, F("repeated_int64"), 202);
  reflection->AddUInt32(message, F("repeated_uint32"), 203);
  reflection->AddUInt64(message, F("repeated_uint64"), 204);
  reflection->AddInt32(message, F("repeated_sint32"), 205);
  reflection->AddInt64(message, F("repeated_sint64"), 206);
  reflection->AddUInt32(message, F("repeated_fixed32"), 207);
  reflection->AddUInt64(message, F("repeated_fixed64"), 208);
  reflection->AddInt32(message, F("repeated_sfixed32"), 209);
  reflection->AddInt64(message, F("repeated_sfixed64"), 210);
  reflection->AddFloat(message, F("repeated_float"), 211);
  reflection->AddDouble(message, F("repeated_double"), 212);
  reflection->AddBool(message, F("repeated_bool"), true);
  reflection->AddString(message, F("repeated_string"), "215");
  reflection->AddString(message, F("repeated_bytes"), "216");

  sub_message = reflection->AddMessage(message, F("repeatedgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 217);
  sub_message = reflection->AddMessage(message, F("repeated_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 218);
  sub_message = reflection->AddMessage(message, F("repeated_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 219);
  sub_message = reflection->AddMessage(message, F("repeated_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 220);
  sub_message = reflection->AddMessage(message, F("repeated_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 227);

  reflection->AddEnum(message, F("repeated_nested_enum"), nested_bar_);
  reflection->AddEnum(message, F("repeated_foreign_enum"), foreign_bar_);
  reflection->AddEnum(message, F("repeated_import_enum"), import_bar_);

  reflection->AddString(message, F("repeated_string_piece"), "224");
  reflection->AddString(message, F("repeated_cord"), "225");

  // Add a second one of each field.
  reflection->AddInt32(message, F("repeated_int32"), 301);
  reflection->AddInt64(message, F("repeated_int64"), 302);
  reflection->AddUInt32(message, F("repeated_uint32"), 303);
  reflection->AddUInt64(message, F("repeated_uint64"), 304);
  reflection->AddInt32(message, F("repeated_sint32"), 305);
  reflection->AddInt64(message, F("repeated_sint64"), 306);
  reflection->AddUInt32(message, F("repeated_fixed32"), 307);
  reflection->AddUInt64(message, F("repeated_fixed64"), 308);
  reflection->AddInt32(message, F("repeated_sfixed32"), 309);
  reflection->AddInt64(message, F("repeated_sfixed64"), 310);
  reflection->AddFloat(message, F("repeated_float"), 311);
  reflection->AddDouble(message, F("repeated_double"), 312);
  reflection->AddBool(message, F("repeated_bool"), false);
  reflection->AddString(message, F("repeated_string"), "315");
  reflection->AddString(message, F("repeated_bytes"), "316");

  sub_message = reflection->AddMessage(message, F("repeatedgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 317);
  sub_message = reflection->AddMessage(message, F("repeated_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 318);
  sub_message = reflection->AddMessage(message, F("repeated_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 319);
  sub_message = reflection->AddMessage(message, F("repeated_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 320);
  sub_message = reflection->AddMessage(message, F("repeated_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 327);

  reflection->AddEnum(message, F("repeated_nested_enum"), nested_baz_);
  reflection->AddEnum(message, F("repeated_foreign_enum"), foreign_baz_);
  reflection->AddEnum(message, F("repeated_import_enum"), import_baz_);

  reflection->AddString(message, F("repeated_string_piece"), "324");
  reflection->AddString(message, F("repeated_cord"), "325");

  // -----------------------------------------------------------------

  reflection->SetInt32(message, F("default_int32"), 401);
  reflection->SetInt64(message, F("default_int64"), 402);
  reflection->SetUInt32(message, F("default_uint32"), 403);
  reflection->SetUInt64(message, F("default_uint64"), 404);
  reflection->SetInt32(message, F("default_sint32"), 405);
  reflection->SetInt64(message, F("default_sint64"), 406);
  reflection->SetUInt32(message, F("default_fixed32"), 407);
  reflection->SetUInt64(message, F("default_fixed64"), 408);
  reflection->SetInt32(message, F("default_sfixed32"), 409);
  reflection->SetInt64(message, F("default_sfixed64"), 410);
  reflection->SetFloat(message, F("default_float"), 411);
  reflection->SetDouble(message, F("default_double"), 412);
  reflection->SetBool(message, F("default_bool"), false);
  reflection->SetString(message, F("default_string"), "415");
  reflection->SetString(message, F("default_bytes"), "416");

  reflection->SetEnum(message, F("default_nested_enum"), nested_foo_);
  reflection->SetEnum(message, F("default_foreign_enum"), foreign_foo_);
  reflection->SetEnum(message, F("default_import_enum"), import_foo_);

  reflection->SetString(message, F("default_string_piece"), "424");
  reflection->SetString(message, F("default_cord"), "425");

  reflection->SetUInt32(message, F("oneof_uint32"), 601);
  sub_message = reflection->MutableMessage(message, F("oneof_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 602);
  reflection->SetString(message, F("oneof_string"), "603");
  reflection->SetString(message, F("oneof_bytes"), "604");
}